

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wln.h
# Opt level: O2

int Wln_ObjRangeBeg(Wln_Ntk_t *p,int i)

{
  Hash_IntMan_t *p_00;
  int i_00;
  Hash_IntObj_t *pHVar1;
  
  p_00 = p->pRanges;
  i_00 = Vec_IntEntry(&p->vRanges,i);
  pHVar1 = Hash_IntObj(p_00,i_00);
  return pHVar1->iData1;
}

Assistant:

static inline int          Wln_ObjRangeBeg( Wln_Ntk_t * p, int i )               { return Hash_IntObjData1( p->pRanges, Wln_ObjRangeId(p, i) );               }